

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

void __thiscall caffe::SolverState::InternalSwap(SolverState *this,SolverState *other)

{
  int32 iVar1;
  uint32 uVar2;
  int iVar3;
  string *psVar4;
  void *pvVar5;
  UnknownFieldSet *other_00;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->history_).super_RepeatedPtrFieldBase,
             &(other->history_).super_RepeatedPtrFieldBase);
  psVar4 = (this->learned_net_).ptr_;
  (this->learned_net_).ptr_ = (other->learned_net_).ptr_;
  (other->learned_net_).ptr_ = psVar4;
  iVar1 = this->iter_;
  this->iter_ = other->iter_;
  other->iter_ = iVar1;
  iVar1 = this->current_step_;
  this->current_step_ = other->current_step_;
  other->current_step_ = iVar1;
  uVar2 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar2;
  pvVar5 = (other->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    if (((ulong)pvVar5 & 1) == 0) goto LAB_0048d50b;
LAB_0048d4fe:
    other_00 = (UnknownFieldSet *)((ulong)pvVar5 & 0xfffffffffffffffe);
  }
  else {
    if (((ulong)pvVar5 & 1) != 0) goto LAB_0048d4fe;
    other_00 = google::protobuf::internal::
               InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ::mutable_unknown_fields_slow
                         (&(other->_internal_metadata_).
                           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                         );
  }
  google::protobuf::internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,other_00)
  ;
LAB_0048d50b:
  iVar3 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar3;
  return;
}

Assistant:

void SolverState::InternalSwap(SolverState* other) {
  history_.InternalSwap(&other->history_);
  learned_net_.Swap(&other->learned_net_);
  std::swap(iter_, other->iter_);
  std::swap(current_step_, other->current_step_);
  std::swap(_has_bits_[0], other->_has_bits_[0]);
  _internal_metadata_.Swap(&other->_internal_metadata_);
  std::swap(_cached_size_, other->_cached_size_);
}